

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPathLabel.cxx
# Opt level: O2

void __thiscall cmPathLabel::cmPathLabel(cmPathLabel *this,string *label)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  uint uVar4;
  
  std::__cxx11::string::string((string *)this,(string *)label);
  this->Hash = 0;
  pcVar1 = (this->Label)._M_dataplus._M_p;
  sVar2 = (this->Label)._M_string_length;
  uVar4 = 0;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    uVar4 = (uVar4 + (int)pcVar1[sVar3]) * 0x401;
    uVar4 = uVar4 >> 6 ^ uVar4;
    this->Hash = uVar4;
  }
  this->Hash = (uVar4 * 9 >> 0xb ^ uVar4 * 9) * 0x8001;
  return;
}

Assistant:

cmPathLabel::cmPathLabel(const std::string& label)
: Label(label), Hash(0)
{
  // Use a Jenkins one-at-a-time hash with under/over-flow protection
  for(size_t i = 0; i < this->Label.size(); ++i)
    {
    this->Hash += this->Label[i];
    this->Hash += ((this->Hash & 0x003FFFFF) << 10);
    this->Hash ^= ((this->Hash & 0xFFFFFFC0) >> 6);
    }
  this->Hash += ((this->Hash & 0x1FFFFFFF) << 3);
  this->Hash ^= ((this->Hash & 0xFFFFF800) >> 11);
  this->Hash += ((this->Hash & 0x0001FFFF) << 15);
}